

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_15d176c::Parser::State::~State(State *this)

{
  __node_ptr in_RSI;
  
  std::_Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::~_Vector_base
            (&(this->expected_operands).
              super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->endian_converted_words).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::~_Vector_base
            (&(this->operands).
              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->import_id_to_ext_inst_type)._M_h);
  std::__detail::
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>_>_>
  ::_M_deallocate_nodes
            ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>_>_>
              *)(this->type_id_to_number_type_info)._M_h._M_before_begin._M_nxt,in_RSI);
  memset((this->type_id_to_number_type_info)._M_h._M_buckets,0,
         (this->type_id_to_number_type_info)._M_h._M_bucket_count << 3);
  (this->type_id_to_number_type_info)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->type_id_to_number_type_info)._M_h._M_element_count = 0;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_std::allocator<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_deallocate_buckets(&(this->type_id_to_number_type_info)._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->id_to_type_id)._M_h);
  return;
}

Assistant:

State(const uint32_t* words_arg, size_t num_words_arg,
          spv_diagnostic* diagnostic_arg)
        : words(words_arg),
          num_words(num_words_arg),
          diagnostic(diagnostic_arg),
          word_index(0),
          instruction_count(0),
          endian(),
          requires_endian_conversion(false) {
      // Temporary storage for parser state within a single instruction.
      // Most instructions require fewer than 25 words or operands.
      operands.reserve(25);
      endian_converted_words.reserve(25);
      expected_operands.reserve(25);
    }